

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimizer_engine.cpp
# Opt level: O0

void ram::MinimizerEngine::
     RadixSort<__gnu_cxx::__normal_iterator<ram::MinimizerEngine::Match*,std::vector<ram::MinimizerEngine::Match,std::allocator<ram::MinimizerEngine::Match>>>,unsigned_long(*)(ram::MinimizerEngine::Match_const&)>
               (__normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
                first,__normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
                      last,uint8_t max_bits,_func_unsigned_long_Match_ptr *comp)

{
  uint64_t __n;
  pointer pMVar1;
  bool bVar2;
  size_type __n_00;
  reference pMVar3;
  reference pMVar4;
  ulong uVar5;
  __normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
  local_10a0;
  __normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
  local_1098;
  __normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
  it_1;
  uint64_t j;
  uint64_t i;
  __normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
  it;
  uint64_t counts [256];
  byte local_869;
  uint8_t shift;
  uint64_t buckets [256];
  iterator end;
  iterator begin;
  allocator<ram::MinimizerEngine::Match> local_41;
  undefined1 local_40 [8];
  vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_> tmp;
  _func_unsigned_long_Match_ptr *comp_local;
  __normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
  _Stack_18;
  uint8_t max_bits_local;
  __normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
  last_local;
  __normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
  first_local;
  
  tmp.super__Vector_base<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)comp;
  _Stack_18._M_current = last._M_current;
  last_local = first;
  bVar2 = __gnu_cxx::operator>=(&last_local,&stack0xffffffffffffffe8);
  if (!bVar2) {
    __n_00 = __gnu_cxx::operator-(&stack0xffffffffffffffe8,&last_local);
    std::allocator<ram::MinimizerEngine::Match>::allocator(&local_41);
    std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>::vector
              ((vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_> *)
               local_40,__n_00,&local_41);
    std::allocator<ram::MinimizerEngine::Match>::~allocator(&local_41);
    end = std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>::
          begin((vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_> *
                )local_40);
    buckets[0xff] =
         (uint64_t)
         std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>::end
                   ((vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>
                     *)local_40);
    memset(&stack0xfffffffffffff798,0,0x800);
    for (local_869 = 0; local_869 < max_bits; local_869 = local_869 + 8) {
      memset(&it,0,0x800);
      i = (uint64_t)last_local._M_current;
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
                                 *)&i,&stack0xffffffffffffffe8),
            pMVar1 = tmp.
                     super__Vector_base<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage, bVar2) {
        pMVar3 = __gnu_cxx::
                 __normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
                 ::operator*((__normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
                              *)&i);
        uVar5 = (*(code *)pMVar1)(pMVar3);
        uVar5 = uVar5 >> (local_869 & 0x3f) & 0xff;
        counts[uVar5 - 1] = counts[uVar5 - 1] + 1;
        __gnu_cxx::
        __normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
        ::operator++((__normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
                      *)&i);
      }
      it_1._M_current = (Match *)0x0;
      for (j = 0; j < 0x100; j = j + 1) {
        buckets[j - 1] = (uint64_t)it_1._M_current;
        it_1._M_current = (Match *)((long)&(it_1._M_current)->group + counts[j - 1]);
      }
      local_1098._M_current = last_local._M_current;
      while (bVar2 = __gnu_cxx::operator!=(&local_1098,&stack0xffffffffffffffe8), bVar2) {
        pMVar3 = __gnu_cxx::
                 __normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
                 ::operator*(&local_1098);
        pMVar1 = tmp.
                 super__Vector_base<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pMVar4 = __gnu_cxx::
                 __normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
                 ::operator*(&local_1098);
        uVar5 = (*(code *)pMVar1)(pMVar4);
        uVar5 = uVar5 >> (local_869 & 0x3f) & 0xff;
        __n = buckets[uVar5 - 1];
        buckets[uVar5 - 1] = __n + 1;
        local_10a0 = __gnu_cxx::
                     __normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
                     ::operator+(&end,__n);
        pMVar4 = __gnu_cxx::
                 __normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
                 ::operator*(&local_10a0);
        pMVar4->group = pMVar3->group;
        pMVar4->positions = pMVar3->positions;
        __gnu_cxx::
        __normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
        ::operator++(&local_1098);
      }
      std::
      swap<__gnu_cxx::__normal_iterator<ram::MinimizerEngine::Match*,std::vector<ram::MinimizerEngine::Match,std::allocator<ram::MinimizerEngine::Match>>>>
                (&end,&last_local);
      std::
      swap<__gnu_cxx::__normal_iterator<ram::MinimizerEngine::Match*,std::vector<ram::MinimizerEngine::Match,std::allocator<ram::MinimizerEngine::Match>>>>
                ((__normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
                  *)(buckets + 0xff),&stack0xffffffffffffffe8);
    }
    if (((ulong)local_869 / 8 & 1) != 0) {
      while (bVar2 = __gnu_cxx::operator!=(&last_local,&stack0xffffffffffffffe8), bVar2) {
        pMVar3 = __gnu_cxx::
                 __normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
                 ::operator*(&last_local);
        pMVar4 = __gnu_cxx::
                 __normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
                 ::operator*(&end);
        pMVar4->group = pMVar3->group;
        pMVar4->positions = pMVar3->positions;
        __gnu_cxx::
        __normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
        ::operator++(&last_local);
        __gnu_cxx::
        __normal_iterator<ram::MinimizerEngine::Match_*,_std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>_>
        ::operator++(&end);
      }
    }
    std::vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_>::~vector
              ((vector<ram::MinimizerEngine::Match,_std::allocator<ram::MinimizerEngine::Match>_> *)
               local_40);
  }
  return;
}

Assistant:

void MinimizerEngine::RadixSort(
    RandomAccessIterator first,
    RandomAccessIterator last,
    std::uint8_t max_bits,
    Compare comp) {  //  unary comparison function
  if (first >= last) {
    return;
  }

  std::vector<typename std::iterator_traits<RandomAccessIterator>::value_type> tmp(last - first);  // NOLINT
  auto begin = tmp.begin();
  auto end = tmp.end();

  std::uint64_t buckets[0x100]{};  // 256 b
  std::uint8_t shift = 0;
  for (; shift < max_bits; shift += 8) {
    std::uint64_t counts[0x100]{};
    for (auto it = first; it != last; ++it) {
      ++counts[comp(*it) >> shift & 0xFF];
    }
    for (std::uint64_t i = 0, j = 0; i < 0x100; j += counts[i++]) {
      buckets[i] = j;
    }
    for (auto it = first; it != last; ++it) {
      *(begin + buckets[comp(*it) >> shift & 0xFF]++) = *it;
    }
    std::swap(begin, first);
    std::swap(end, last);
  }

  if (shift / 8 & 1) {  // copy the sorted array for odd cases
    for (; first != last; ++first, ++begin) {
      *begin = *first;
    }
  }
}